

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O0

size_t embree::mapThreadID(size_t threadID)

{
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  int iVar4;
  size_type sVar5;
  reference pvVar6;
  Lock<embree::MutexSys> *pLVar7;
  pthread_t __th;
  Lock<embree::MutexSys> *in_RDI;
  size_t __cpu;
  int j_1;
  int i_2;
  cpu_set_t set;
  size_t ID;
  size_t j;
  size_t i_1;
  int i;
  string cpu;
  fstream fs;
  size_t cpuID;
  Lock<embree::MutexSys> lock;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffbc8;
  Lock<embree::MutexSys> *in_stack_fffffffffffffbd0;
  anon_class_8_1_54a39809_for__M_pred in_stack_fffffffffffffbe0;
  Lock<embree::MutexSys> *pLVar8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffbe8;
  value_type vVar9;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffbf0;
  ulong uVar10;
  undefined4 in_stack_fffffffffffffc00;
  int in_stack_fffffffffffffc04;
  undefined1 *in_stack_fffffffffffffc08;
  long *in_stack_fffffffffffffc18;
  int local_3b8;
  int local_3b4;
  cpu_set_t local_3b0;
  Lock<embree::MutexSys> *local_330;
  ulong local_328;
  ulong local_320;
  long local_318;
  int *local_310;
  unsigned_long *local_308;
  unsigned_long *local_300;
  int local_2f4;
  int local_2f0;
  allocator local_2e9;
  string local_2e8 [32];
  string local_2c8 [39];
  allocator local_2a1;
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [48];
  istream local_230 [528];
  long local_20;
  Lock<embree::MutexSys> *local_8;
  
  local_8 = in_RDI;
  Lock<embree::MutexSys>::Lock(in_stack_fffffffffffffbd0,(MutexSys *)in_stack_fffffffffffffbc8);
  sVar5 = Catch::clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)threadIDs);
  if (sVar5 == 0) {
    local_20 = 0;
    while( true ) {
      std::fstream::fstream(local_230);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2a0,"/sys/devices/system/cpu/cpu",&local_2a1);
      std::__cxx11::to_string((longlong)in_stack_fffffffffffffc18);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffc08,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2e8,"/topology/thread_siblings_list",&local_2e9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffc08,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
      std::__cxx11::string::~string(local_2e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
      std::__cxx11::string::~string(local_280);
      std::__cxx11::string::~string(local_2c8);
      std::__cxx11::string::~string(local_2a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
      _Var3 = std::__cxx11::string::c_str();
      std::fstream::open((char *)local_230,_Var3);
      bVar1 = std::ios::fail();
      if ((bVar1 & 1) == 0) {
        while( true ) {
          in_stack_fffffffffffffc18 = (long *)std::istream::operator>>(local_230,&local_2f4);
          bVar2 = std::ios::operator_cast_to_bool
                            ((ios *)((long)in_stack_fffffffffffffc18 +
                                    *(long *)(*in_stack_fffffffffffffc18 + -0x18)));
          if (!bVar2) break;
          in_stack_fffffffffffffc08 = threadIDs;
          local_300 = (unsigned_long *)
                      Catch::clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                      begin(in_stack_fffffffffffffbc8);
          local_308 = (unsigned_long *)
                      Catch::clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                (in_stack_fffffffffffffbc8);
          local_310 = &local_2f4;
          bVar2 = std::
                  none_of<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,embree::mapThreadID(unsigned_long)::__0>
                            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
                             in_stack_fffffffffffffbe0);
          if (bVar2) {
            local_318 = (long)local_2f4;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffffbd0,(value_type_conflict1 *)in_stack_fffffffffffffbc8);
          }
          in_stack_fffffffffffffc04 = std::istream::peek();
          if (in_stack_fffffffffffffc04 == 0x2c) {
            std::istream::ignore();
          }
        }
        std::fstream::close();
        local_2f0 = 0;
      }
      else {
        local_2f0 = 2;
      }
      std::__cxx11::string::~string(local_260);
      std::fstream::~fstream(local_230);
      if (local_2f0 != 0) break;
      local_20 = local_20 + 1;
    }
    for (local_320 = 0; uVar10 = local_320,
        sVar5 = Catch::clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)threadIDs),
        uVar10 < sVar5; local_320 = local_320 + 1) {
      local_328 = 0;
      while (uVar10 = local_328,
            sVar5 = Catch::clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)threadIDs),
            uVar10 < sVar5) {
        if (local_320 != local_328) {
          pvVar6 = Catch::clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                   operator[]((vector<unsigned_long,_std::allocator<unsigned_long>_> *)threadIDs,
                              local_320);
          vVar9 = *pvVar6;
          pvVar6 = Catch::clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                   operator[]((vector<unsigned_long,_std::allocator<unsigned_long>_> *)threadIDs,
                              local_328);
          if (vVar9 == *pvVar6) {
            Catch::clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1fc22c);
          }
        }
        local_328 = local_328 + 1;
      }
    }
  }
  local_330 = local_8;
  pLVar8 = local_8;
  pLVar7 = (Lock<embree::MutexSys> *)
           Catch::clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)threadIDs);
  if (pLVar8 < pLVar7) {
    pvVar6 = Catch::clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)threadIDs,
                        (size_type)local_8);
    local_330 = (Lock<embree::MutexSys> *)*pvVar6;
  }
  memset(&local_3b0,0,0x80);
  __th = pthread_self();
  iVar4 = pthread_getaffinity_np(__th,0x80,&local_3b0);
  if (iVar4 == 0) {
    local_3b8 = 0;
    for (local_3b4 = 0; local_3b4 < 0x400; local_3b4 = local_3b4 + 1) {
      if ((ulong)(long)local_3b4 >> 3 < 0x80) {
        bVar2 = (local_3b0.__bits[(ulong)(long)local_3b4 >> 6] & 1L << ((byte)local_3b4 & 0x3f)) !=
                0;
      }
      else {
        bVar2 = false;
      }
      if (bVar2) {
        if ((Lock<embree::MutexSys> *)(long)local_3b8 == local_330) {
          local_330 = (Lock<embree::MutexSys> *)(long)local_3b4;
          break;
        }
        local_3b8 = local_3b8 + 1;
      }
    }
  }
  local_2f0 = 1;
  Lock<embree::MutexSys>::~Lock(local_330);
  return (size_t)local_330;
}

Assistant:

size_t mapThreadID(size_t threadID)
  {
    Lock<MutexSys> lock(mutex);
    
    if (threadIDs.size() == 0)
    {
      /* parse thread/CPU topology */
      for (size_t cpuID=0;;cpuID++)
      {
        std::fstream fs;
        std::string cpu = std::string("/sys/devices/system/cpu/cpu") + std::to_string((long long)cpuID) + std::string("/topology/thread_siblings_list");
        fs.open (cpu.c_str(), std::fstream::in);
        if (fs.fail()) break;

        int i;
        while (fs >> i) 
        {
          if (std::none_of(threadIDs.begin(),threadIDs.end(),[&] (int id) { return id == i; }))
            threadIDs.push_back(i);
          if (fs.peek() == ',') 
            fs.ignore();
        }
        fs.close();
      }

#if 0
      for (size_t i=0;i<threadIDs.size();i++)
        std::cout << i << " -> " << threadIDs[i] << std::endl;
#endif

      /* verify the mapping and do not use it if the mapping has errors */
      for (size_t i=0;i<threadIDs.size();i++) {
        for (size_t j=0;j<threadIDs.size();j++) {
          if (i != j && threadIDs[i] == threadIDs[j]) {
            threadIDs.clear();
          }
        }
      }
    }

    /* re-map threadIDs if mapping is available */
    size_t ID = threadID;
    if (threadID < threadIDs.size())
      ID = threadIDs[threadID];

    /* find correct thread to affinitize to */
    cpu_set_t set;
    CPU_ZERO(&set);
    
    if (pthread_getaffinity_np(pthread_self(), sizeof(set), &set) == 0)
    {
      for (int i=0, j=0; i<CPU_SETSIZE; i++)
      {
        if (!CPU_ISSET(i,&set)) continue;

        if (j == ID) {
          ID = i;
          break;
        }
        j++;
      }
    }

    return ID;
  }